

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.cpp
# Opt level: O3

void __thiscall DTreePropagator::explain_cycle(DTreePropagator *this,int u,int v,vec<Lit> *pathe)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  BoolView *pBVar4;
  ulong uVar5;
  ulong uVar6;
  vector<int,_std::allocator<int>_> pathn;
  Lit local_4c;
  vector<int,_std::allocator<int>_> local_48;
  
  RerootedUnionFind<Tint>::connectionsFromTo(&local_48,&this->ruf,u,v);
  if ((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 4) {
    uVar2 = 1;
    uVar5 = 0;
    do {
      uVar6 = (ulong)uVar2;
      uVar1 = (*(this->super_DReachabilityPropagator).super_GraphPropagator.super_Propagator.
                _vptr_Propagator[0x17])
                        (this,(ulong)(uint)local_48.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start[uVar5],
                         (ulong)(uint)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start[uVar6]);
      if (uVar1 == 0xffffffff) {
LAB_0017c468:
        uVar1 = (*(this->super_DReachabilityPropagator).super_GraphPropagator.super_Propagator.
                  _vptr_Propagator[0x17])
                          (this,(ulong)(uint)local_48.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_start[uVar6],
                           (ulong)(uint)local_48.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start[uVar5]);
        pBVar4 = (this->super_DReachabilityPropagator).super_GraphPropagator.es.data;
        uVar3 = (ulong)uVar1;
      }
      else {
        pBVar4 = (this->super_DReachabilityPropagator).super_GraphPropagator.es.data;
        uVar3 = (ulong)uVar1;
        if ((sat.assigns.data[(uint)pBVar4[uVar3].v] == '\0') ||
           ((uint)pBVar4[uVar3].s * 2 + -1 == (int)sat.assigns.data[(uint)pBVar4[uVar3].v]))
        goto LAB_0017c468;
      }
      local_4c.x = (uint)((int)sat.assigns.data[(uint)pBVar4[uVar3].v] - 1U < 0xfffffffd) +
                   pBVar4[uVar3].v * 2;
      vec<Lit>::push(pathe,&local_4c);
      uVar2 = uVar2 + 1;
      uVar5 = uVar6;
    } while (uVar6 < ((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2) - 1U);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void DTreePropagator::explain_cycle(int u, int v, vec<Lit>& pathe) {
	assert(u != v);
	std::vector<int> pathn = ruf.connectionsFromTo(u, v);
	assert(!pathn.empty());
	for (unsigned int k = 0; k < pathn.size() - 1; k++) {
		int de = findEdge(pathn[k], pathn[k + 1]);
		if (de == -1 || !getEdgeVar(de).isFixed() || getEdgeVar(de).isFalse()) {
			de = findEdge(pathn[k + 1], pathn[k]);
		}
		assert(de != -1);
		assert(getEdgeVar(de).isFixed());
		assert(getEdgeVar(de).isTrue());
		pathe.push(getEdgeVar(de).getValLit());
	}
}